

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void unlink_cb(uv_fs_t *req)

{
  if (req == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_00153d35;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_00153d35:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (req == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00153d99;
    if (rmdir_req.result != 0) goto LAB_00153d9e;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_00153da8;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00153d99:
    rmdir_cb_cold_2();
LAB_00153d9e:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00153da8:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x1000a);
  return;
}

Assistant:

static void unlink_cb(uv_fs_t* req) {
  ASSERT(req == &unlink_req);
  ASSERT(req->fs_type == UV_FS_UNLINK);
  ASSERT(req->result == 0);
  unlink_cb_count++;
  uv_fs_req_cleanup(req);
}